

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

char * __thiscall google::protobuf::FastInt64ToBufferLeft(protobuf *this,int64 i,char *buffer)

{
  char *pcVar1;
  protobuf *local_20;
  uint64 u;
  char *buffer_local;
  int64 i_local;
  
  local_20 = this;
  u = i;
  if ((long)this < 0) {
    u = i + 1;
    *(undefined1 *)i = 0x2d;
    local_20 = (protobuf *)-(long)this;
  }
  pcVar1 = FastUInt64ToBufferLeft(local_20,u,buffer);
  return pcVar1;
}

Assistant:

char* FastInt64ToBufferLeft(int64 i, char* buffer) {
  uint64 u = 0;
  if (i < 0) {
    *buffer++ = '-';
    u -= i;
  } else {
    u = i;
  }
  return FastUInt64ToBufferLeft(u, buffer);
}